

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall spv::Builder::dumpSourceInstructions(Builder *this,Vector<unsigned_int> *out)

{
  Id IVar1;
  size_type sVar2;
  Instruction sourceContinuedInst;
  Instruction sourceInst;
  String subString;
  Instruction local_c0;
  undefined1 local_88 [24];
  pointer local_70;
  iterator iStack_68;
  uint *local_60;
  Block *pBStack_58;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  if (this->source == SourceLanguageUnknown) {
    return;
  }
  local_88._0_8_ = &PTR__Instruction_001f31e0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = OpSource;
  local_70 = (pointer)0x0;
  iStack_68._M_current = (uint *)0x0;
  local_60 = (uint *)0x0;
  pBStack_58 = (Block *)0x0;
  local_c0._vptr_Instruction._0_4_ = this->source;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_70,
             (iterator)0x0,(uint *)&local_c0);
  local_c0._vptr_Instruction._0_4_ = this->sourceVersion;
  if (iStack_68._M_current == local_60) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_70,
               iStack_68,(uint *)&local_c0);
  }
  else {
    *iStack_68._M_current = (SourceLanguage)local_c0._vptr_Instruction;
    iStack_68._M_current = iStack_68._M_current + 1;
  }
  IVar1 = this->sourceFileStringId;
  if (IVar1 != 0) {
    local_c0._vptr_Instruction._0_4_ = IVar1;
    if (iStack_68._M_current == local_60) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_70,
                 iStack_68,(uint *)&local_c0);
    }
    else {
      *iStack_68._M_current = IVar1;
      iStack_68._M_current = iStack_68._M_current + 1;
    }
    sVar2 = (this->sourceText)._M_string_length;
    if (sVar2 != 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      if (0 < (int)sVar2) {
        sVar2 = 0;
        do {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&local_c0,&this->sourceText,sVar2,0x3ffeb);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          operator=(&local_50,
                    (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&local_c0);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          _M_dispose((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&local_c0);
          if (sVar2 == 0) {
            Instruction::addStringOperand((Instruction *)local_88,local_50._M_dataplus._M_p);
            Instruction::dump((Instruction *)local_88,out);
          }
          else {
            local_c0._vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
            local_c0.resultId = 0;
            local_c0.typeId = 0;
            local_c0.opCode = OpSourceContinued;
            local_c0.operands.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_c0.block = (Block *)0x0;
            local_c0.operands.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_c0.operands.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            Instruction::addStringOperand(&local_c0,local_50._M_dataplus._M_p);
            Instruction::dump(&local_c0,out);
            local_c0._vptr_Instruction._0_4_ = 0x1f31e0;
            local_c0._vptr_Instruction._4_4_ = 0;
            std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
            ~_Vector_base(&local_c0.operands.
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         );
          }
          sVar2 = sVar2 + 0x3ffeb;
        } while ((int)sVar2 < (int)(this->sourceText)._M_string_length);
      }
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::_M_dispose
                (&local_50);
      goto LAB_001ba558;
    }
  }
  Instruction::dump((Instruction *)local_88,out);
LAB_001ba558:
  local_88._0_8_ = &PTR__Instruction_001f31e0;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)&local_70)
  ;
  return;
}

Assistant:

void Builder::dumpSourceInstructions(dxil_spv::Vector<unsigned int>& out) const
{
    const int maxWordCount = 0xFFFF;
    const int opSourceWordCount = 4;
    const int nonNullBytesPerInstruction = 4 * (maxWordCount - opSourceWordCount) - 1;

    if (source != SourceLanguageUnknown) {
        // OpSource Language Version File Source
        Instruction sourceInst(NoResult, NoType, OpSource);
        sourceInst.addImmediateOperand(source);
        sourceInst.addImmediateOperand(sourceVersion);
        // File operand
        if (sourceFileStringId != NoResult) {
            sourceInst.addIdOperand(sourceFileStringId);
            // Source operand
            if (sourceText.size() > 0) {
                int nextByte = 0;
                dxil_spv::String subString;
                while ((int)sourceText.size() - nextByte > 0) {
                    subString = sourceText.substr(nextByte, nonNullBytesPerInstruction);
                    if (nextByte == 0) {
                        // OpSource
                        sourceInst.addStringOperand(subString.c_str());
                        sourceInst.dump(out);
                    } else {
                        // OpSourcContinued
                        Instruction sourceContinuedInst(OpSourceContinued);
                        sourceContinuedInst.addStringOperand(subString.c_str());
                        sourceContinuedInst.dump(out);
                    }
                    nextByte += nonNullBytesPerInstruction;
                }
            } else
                sourceInst.dump(out);
        } else
            sourceInst.dump(out);
    }
}